

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O2

void __thiscall
BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::Log
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *this,string *msg)

{
  long lVar1;
  bool bVar2;
  Level level;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *pTVar3;
  LogFlags flag;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  int source_line;
  string full_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar3 = this;
  LogMsg(&full_msg,this,msg);
  if (this->m_log_category == ALL) {
    level = Info;
    flag = ALL;
    source_line = 0x38;
  }
  else {
    bVar2 = ::LogAcceptCategory(this->m_log_category,(Level)pTVar3);
    if (!bVar2) goto LAB_002a16b1;
    flag = this->m_log_category;
    level = Debug;
    source_line = 0x3a;
  }
  logging_function._M_str = "Log";
  logging_function._M_len = 3;
  source_file._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/logging/timer.h";
  source_file._M_len = 0x58;
  ::LogPrintf_<std::__cxx11::string>
            (logging_function,source_file,source_line,flag,level,(char *)&full_msg,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             full_msg._M_dataplus._M_p);
LAB_002a16b1:
  std::__cxx11::string::~string((string *)&full_msg);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Log(const std::string& msg)
    {
        const std::string full_msg = this->LogMsg(msg);

        if (m_log_category == BCLog::LogFlags::ALL) {
            LogPrintf("%s\n", full_msg);
        } else {
            LogDebug(m_log_category, "%s\n", full_msg);
        }
    }